

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

bool __thiscall Tokenizer::tryToGetKeywordOrIdentifier(Tokenizer *this)

{
  mapped_type mVar1;
  Mark MVar2;
  char cVar3;
  int iVar4;
  Mark *pMVar5;
  const_iterator cVar6;
  mapped_type *pmVar7;
  bool bVar8;
  string *this_00;
  string str;
  stringstream ss;
  key_type local_240;
  string local_220 [32];
  string local_200 [32];
  Token local_1e0;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  pMVar5 = Stream::getMark(&this->stream_);
  MVar2 = *pMVar5;
  cVar3 = Stream::peek(&this->stream_);
  iVar4 = isalpha((int)cVar3);
  if (iVar4 == 0) {
    cVar3 = Stream::peek(&this->stream_);
    if (cVar3 != '_') {
      bVar8 = false;
      goto LAB_0014dfef;
    }
  }
  cVar3 = Stream::peek(&this->stream_);
  std::operator<<(local_198,cVar3);
  Stream::advance(&this->stream_);
  do {
    cVar3 = Stream::peek(&this->stream_);
    iVar4 = isalpha((int)cVar3);
    if (iVar4 == 0) {
      cVar3 = Stream::peek(&this->stream_);
      if (9 < (int)cVar3 - 0x30U) {
        cVar3 = Stream::peek(&this->stream_);
        if (cVar3 != '_') break;
      }
    }
    cVar3 = Stream::peek(&this->stream_);
    std::operator<<(local_198,cVar3);
    Stream::advance(&this->stream_);
  } while( true );
  std::__cxx11::stringbuf::str();
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&keywords__abi_cxx11_._M_t,&local_240);
  local_1e0.mark = MVar2;
  if ((_Rb_tree_header *)cVar6._M_node == &keywords__abi_cxx11_._M_t._M_impl.super__Rb_tree_header)
  {
    std::__cxx11::string::string(local_220,(string *)&local_240);
    local_1e0.type = Identifier;
    std::__detail::__variant::_Variant_storage<false,std::__cxx11::string,double>::
    _Variant_storage<0ul,std::__cxx11::string&>
              ((_Variant_storage<false,std::__cxx11::string,double> *)&local_1e0.value,local_220);
    Token::operator=(&this->token_,&local_1e0);
    std::__detail::__variant::
    _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
    ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                         *)&local_1e0.value);
    this_00 = local_220;
  }
  else {
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)&keywordTokenTypes__abi_cxx11_,&local_240);
    mVar1 = *pmVar7;
    std::__cxx11::string::string(local_200,(string *)&local_240);
    local_1e0.type = mVar1;
    std::__detail::__variant::_Variant_storage<false,std::__cxx11::string,double>::
    _Variant_storage<0ul,std::__cxx11::string&>
              ((_Variant_storage<false,std::__cxx11::string,double> *)&local_1e0.value,local_200);
    Token::operator=(&this->token_,&local_1e0);
    std::__detail::__variant::
    _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
    ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                         *)&local_1e0.value);
    this_00 = local_200;
  }
  std::__cxx11::string::~string(this_00);
  std::__cxx11::string::~string((string *)&local_240);
  bVar8 = true;
LAB_0014dfef:
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return bVar8;
}

Assistant:

bool Tokenizer::tryToGetKeywordOrIdentifier()
{
  std::stringstream ss;
  const Mark mark = stream_.getMark();
  if(isalpha(stream_.peek()) || stream_.peek() == '_')
  {
    ss << (char)stream_.peek();
    stream_.advance();
    while(isalpha(stream_.peek()) || isdigit(stream_.peek()) || stream_.peek() == '_')
    {
      ss << (char)stream_.peek();
      stream_.advance();
    }
  }
  else
    return false;

  const std::string str = ss.str();
  if(keywords_.find(str) != keywords_.end())
  {
    const auto type = keywordTokenTypes_.at(str);
    token_ = Token{type, str, mark};
  }
  else
    token_ = Token{TokenType::Identifier, str, mark};

  return true;
}